

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O3

int GetCode(gdIOCtx *fd,CODE_STATIC_DATA *scd,int code_size,int flag,int *ZeroDataBlockP)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  if (flag == 0) {
    iVar4 = scd->curbit;
    iVar2 = iVar4 + code_size;
    if (scd->lastbit <= iVar2) {
      if (scd->done != 0) {
        return -1;
      }
      scd->buf[0] = scd->buf[(long)scd->last_byte + -2];
      scd->buf[1] = scd->buf[(long)scd->last_byte + -1];
      uVar1 = GetDataBlock(fd,scd->buf + 2,ZeroDataBlockP);
      uVar1 = uVar1 & 0xff;
      if (uVar1 == 0) {
        scd->done = 1;
      }
      scd->last_byte = uVar1 + 2;
      iVar2 = scd->curbit - scd->lastbit;
      iVar4 = iVar2 + 0x10;
      scd->curbit = iVar4;
      scd->lastbit = uVar1 * 8 + 0x10;
      iVar2 = iVar2 + code_size + 0x10;
    }
    uVar1 = 0xffffffff;
    if ((iVar2 < 0x8c1) && (uVar1 = 0, 0 < code_size)) {
      iVar3 = 0;
      do {
        uVar5 = iVar4 + iVar3;
        uVar6 = iVar4 + 7 + iVar3;
        if (-1 < (int)uVar5) {
          uVar6 = uVar5;
        }
        uVar1 = uVar1 | (uint)((scd->buf[(int)uVar6 >> 3] >> (uVar5 & 7) & 1) != 0) <<
                        ((byte)iVar3 & 0x1f);
        iVar3 = iVar3 + 1;
      } while (code_size != iVar3);
    }
    scd->curbit = iVar2;
  }
  else {
    scd->curbit = 0;
    scd->lastbit = 0;
    scd->done = 0;
    scd->last_byte = 2;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static int
GetCode(gdIOCtx *fd, CODE_STATIC_DATA *scd, int code_size, int flag, int *ZeroDataBlockP)
{
	int rv;

	rv = GetCode_(fd, scd, code_size,flag, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[GetCode(,%d,%d) returning %d]\n",code_size,flag,rv);
	}

	return rv;
}